

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_lexical_analysis.cpp
# Opt level: O2

compile_errcode __thiscall
LexicalAnalysis::ParseDigit(LexicalAnalysis *this,Symbol *symbol,bool negative)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  compile_errcode cVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  cVar4 = this->ch;
  bVar2 = 1;
  uVar8 = 0xffffffff;
  lVar9 = 0;
  bVar1 = 0;
  do {
    bVar1 = bVar1 | cVar4 == '0' & bVar2;
    lVar6 = lVar9 * 10;
    lVar7 = (long)cVar4;
    lVar9 = lVar6 + lVar7 + -0x30;
    GetChar(this);
    cVar4 = this->ch;
    uVar8 = uVar8 + 1;
    bVar2 = 0;
  } while ((byte)(cVar4 - 0x30U) < 10);
  UnGetChar(this);
  cVar5 = -0x7d2;
  if (uVar8 < 9) {
    if (negative) {
      lVar9 = 0x30 - (lVar6 + lVar7);
    }
    if (((int)lVar9 == lVar9) && (!(bool)(lVar9 != 0 & bVar1))) {
      iVar3 = this->m_character_number;
      symbol->m_line_number = this->m_line_number;
      symbol->m_character_number = iVar3;
      symbol->m_name = INTERGER_SYM;
      Symbol::SetValue<int>(symbol,(int)lVar9);
      cVar5 = 0;
    }
  }
  return cVar5;
}

Assistant:

compile_errcode LexicalAnalysis::ParseDigit(Symbol& symbol, bool negative) {
    long sum = 0;
    int number_count = 0;
    bool first_flag = true;
    bool zero_flag = false;
    do {
        if (first_flag) {
            first_flag = false;
            if (ch == '0')
                zero_flag = true;
        }
        sum = sum * 10 + ch - '0';
        number_count++;
        GetChar();
    } while (c0_compile::isdigit(ch));
    UnGetChar();
    if (number_count < 10) {
        sum = negative ? (-1*sum) : sum;
        if (sum >= INT_MIN && sum <= INT_MAX) {
            if (sum != 0 && zero_flag) {
                return INVALID_DIGIT_ERROR;  // with front zero
            }
            symbol.SetLocate(m_line_number, m_character_number);
            symbol.SetName(INTERGER_SYM);
            symbol.SetValue<int>(sum);
            return COMPILE_OK;
        }
    }
    return INVALID_DIGIT_ERROR;
}